

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem_unix.c
# Opt level: O0

w_status w_vmem_create(w_vmem *mem,void *addr,size_t size)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  size_t local_48;
  int local_40;
  int local_3c;
  int error_1;
  int error;
  void *alloc;
  size_t sStack_28;
  int flags;
  size_t size_local;
  void *addr_local;
  w_vmem *mem_local;
  
  sStack_28 = size;
  size_local = (size_t)addr;
  addr_local = mem;
  if (mem == (w_vmem *)0x0) {
    w_handle_failed_assertion
              ("mem != NULL","w_vmem_create",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x3f);
  }
  sVar4 = size_local;
  if ((size_local != 0) && (sVar3 = w_get_alloc_granularity(), sVar4 % sVar3 != 0)) {
    w_handle_failed_assertion
              ("addr == NULL || (uintptr_t)addr % w_get_alloc_granularity() == 0","w_vmem_create",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x40);
  }
  if (sStack_28 == 0) {
    w_handle_failed_assertion
              ("size > 0","w_vmem_create",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x41);
  }
  uVar1 = sStack_28;
  sVar4 = w_get_alloc_granularity();
  if (uVar1 % sVar4 != 0) {
    w_handle_failed_assertion
              ("size % w_get_alloc_granularity() == 0","w_vmem_create",
               "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
               ,0x42);
  }
  alloc._4_4_ = 0x22;
  if (size_local != 0) {
    alloc._4_4_ = 0x32;
  }
  _error_1 = mmap((void *)size_local,sStack_28,0,alloc._4_4_,-1,0);
  if (_error_1 == (void *)0xffffffffffffffff) {
    piVar5 = __errno_location();
    local_3c = *piVar5;
    if (size_local == 0) {
      wp_log(W_LOG_LVL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,0x53,"failed to reserve %zu bytes of virtual memory\n",sStack_28);
    }
    else {
      wp_log(W_LOG_LVL_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,0x57,"failed to reserve %zu bytes of virtual memory at %p\n",sStack_28,size_local);
    }
    wp_log_system_error(W_LOG_LVL_ALL,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                        ,0x5a,local_3c);
    mem_local._4_4_ = W_ERROR_ALLOC_FAILED;
  }
  else {
    iVar2 = madvise(_error_1,sStack_28,4);
    if (iVar2 != 0) {
      piVar5 = __errno_location();
      local_40 = *piVar5;
      wp_log(W_LOG_LVL_WARNING,
             "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
             ,99,"failed to advise %zu bytes of virtual memory at %p\n",sStack_28,_error_1);
      wp_log_system_error(W_LOG_LVL_ALL,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/src/base/vmem_unix.c"
                          ,100,local_40);
    }
    *(void **)addr_local = _error_1;
    iVar2 = w_mtx_lock(&wp_vmem_tracer_mtx);
    if (iVar2 != 0) {
      w_abort(-8);
    }
    local_48 = sStack_28;
    wp_trace_pool_insert_data
              (wp_vmem_tracer_inst.idx_pool,wp_vmem_tracer_inst.data_pool,0x400,8,addr_local,
               &local_48);
    iVar2 = w_mtx_unlock(&wp_vmem_tracer_mtx);
    if (iVar2 != 0) {
      w_abort(-0xc);
    }
    mem_local._4_4_ = W_SUCCESS;
  }
  return mem_local._4_4_;
}

Assistant:

enum w_status
w_vmem_create(
    struct w_vmem *mem,
    void *addr,
    size_t size
)
{
    int flags;
    void *alloc;

    W_ASSERT(mem != NULL);
    W_ASSERT(addr == NULL || (uintptr_t)addr % w_get_alloc_granularity() == 0);
    W_ASSERT(size > 0);
    W_ASSERT(size % w_get_alloc_granularity() == 0);

    flags = MAP_PRIVATE | MAP_ANONYMOUS;
    if (addr != NULL)
    {
        flags |= MAP_FIXED;
    }

    alloc = mmap(addr, size, PROT_NONE, flags, -1, 0);
    if (alloc == MAP_FAILED)
    {
        int error;

        error = errno;

        if (addr == NULL)
        {
            W_LOG_ERROR(WP_VMEM_GET_ERROR_MSG_NO_ADDR("reserve"), size);
        }
        else 
        {
            W_LOG_ERROR(WP_VMEM_GET_ERROR_MSG("reserve"), size, addr);
        }

        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
        return W_ERROR_ALLOC_FAILED;
    }

    if (madvise(alloc, size, MADV_DONTNEED) != 0)
    {
        int error;

        error = errno;
        W_LOG_WARNING(WP_VMEM_GET_ERROR_MSG("advise"), size, alloc);
        W_LOG_SYSTEM_ERROR(W_LOG_LVL_DEBUG, error);
    }

    mem->addr = alloc;

#if W_TRACING(ENABLED)
    {
        W_TRACER_ATTACH_DATA(
            wp_vmem_tracer,
            mem,
            (
                &(struct wp_vmem_trace_data) {
                    .size = size,
                }
            )
        );
    }
#endif

    return W_SUCCESS;
}